

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

void __thiscall
Centaurus::CompositeATN<char>::CompositeATN(CompositeATN<char> *this,Grammar<char> *grammar)

{
  _Hash_node_base *p_Var1;
  CATNMachine<char> local_48;
  
  this->_vptr_CompositeATN = (_func_int **)&PTR__CompositeATN_001a0c68;
  (this->m_dict)._M_h._M_buckets = &(this->m_dict)._M_h._M_single_bucket;
  (this->m_dict)._M_h._M_bucket_count = 1;
  (this->m_dict)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_dict)._M_h._M_element_count = 0;
  (this->m_dict)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_dict)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_dict)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = (grammar->m_networks)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      CATNMachine<char>::CATNMachine(&local_48,(ATNMachine<char> *)(p_Var1 + 6));
      std::
      _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::CATNMachine<char>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::CATNMachine<char>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<Centaurus::Identifier_const&,Centaurus::CATNMachine<char>>
                ((_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::CATNMachine<char>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::CATNMachine<char>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->m_dict,p_Var1 + 1,&local_48);
      local_48._vptr_CATNMachine = (_func_int **)&PTR__CATNMachine_001a0c98;
      std::vector<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>::~vector
                (&local_48.m_nodes);
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

CompositeATN(const Grammar<TCHAR>& grammar)
    {
        for (const auto& p : grammar.get_machines())
        {
            m_dict.emplace(p.first, CATNMachine<TCHAR>(p.second));
        }
    }